

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O2

iterator __thiscall
re2::SparseArray<re2::NFA::Thread_*>::SetInternal
          (SparseArray<re2::NFA::Thread_*> *this,bool allow_existing,int i,Thread **v)

{
  bool bVar1;
  iterator pIVar2;
  
  DebugCheckInvariants(this);
  if (((this->dense_).ptr_._M_t.
       super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
       ._M_t.
       super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
       .super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>.
       _M_head_impl == (IndexValue *)0x0) ||
     ((uint)(this->dense_).ptr_._M_t.
            super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
            ._M_t.
            super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
            .
            super__Tuple_impl<1UL,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
            .
            super__Head_base<1UL,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter,_false>
      <= (uint)i)) {
    __assert_fail("false && \"illegal index\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/re2-src/re2/sparse_array.h"
                  ,0xd5,
                  "iterator re2::SparseArray<re2::NFA::Thread *>::SetInternal(bool, int, const Value &) [Value = re2::NFA::Thread *]"
                 );
  }
  bVar1 = has_index(this,i);
  if (allow_existing) {
    if (bVar1) goto LAB_001ed559;
  }
  else if (bVar1) {
    __assert_fail("!has_index(i)",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/re2-src/re2/sparse_array.h"
                  ,0xdc,
                  "iterator re2::SparseArray<re2::NFA::Thread *>::SetInternal(bool, int, const Value &) [Value = re2::NFA::Thread *]"
                 );
  }
  create_index(this,i);
LAB_001ed559:
  pIVar2 = SetExistingInternal(this,i,v);
  return pIVar2;
}

Assistant:

iterator SetInternal(bool allow_existing, int i, const Value& v) {
    DebugCheckInvariants();
    if (static_cast<uint32_t>(i) >= static_cast<uint32_t>(max_size())) {
      assert(false && "illegal index");
      // Semantically, end() would be better here, but we already know
      // the user did something stupid, so begin() insulates them from
      // dereferencing an invalid pointer.
      return begin();
    }
    if (!allow_existing) {
      assert(!has_index(i));
      create_index(i);
    } else {
      if (!has_index(i))
        create_index(i);
    }
    return SetExistingInternal(i, v);
  }